

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_waitfds(CURLM *m,curl_waitfd *ufds,uint size,uint *fd_count)

{
  _Bool _Var1;
  uint uVar2;
  undefined1 local_80 [8];
  easy_pollset ps;
  Curl_easy *data;
  uint mid;
  uint need;
  Curl_multi *multi;
  undefined1 local_40 [4];
  CURLMcode result;
  Curl_waitfds cwfds;
  uint *fd_count_local;
  uint size_local;
  curl_waitfd *ufds_local;
  CURLM *m_local;
  
  multi._4_4_ = CURLM_OK;
  data._4_4_ = 0;
  if ((ufds == (curl_waitfd *)0x0) && ((size != 0 || (fd_count == (uint *)0x0)))) {
    m_local._4_4_ = CURLM_BAD_FUNCTION_ARGUMENT;
  }
  else if ((m == (CURLM *)0x0) || (*m != 0xbab1e)) {
    m_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if ((*(byte *)((long)m + 0x271) >> 2 & 1) == 0) {
    _mid = (Curl_multi *)m;
    cwfds._8_8_ = fd_count;
    Curl_waitfds_init((Curl_waitfds *)local_40,ufds,size);
    _Var1 = Curl_uint_bset_first(&_mid->process,(uint *)&data);
    if (_Var1) {
      do {
        ps._24_8_ = Curl_multi_get_easy(_mid,(uint)data);
        if ((Curl_easy *)ps._24_8_ == (Curl_easy *)0x0) {
          Curl_uint_bset_remove(&_mid->process,(uint)data);
        }
        else {
          Curl_multi_getsock((Curl_easy *)ps._24_8_,(easy_pollset *)local_80,"curl_multi_waitfds");
          uVar2 = Curl_waitfds_add_ps((Curl_waitfds *)local_40,(easy_pollset *)local_80);
          data._4_4_ = uVar2 + data._4_4_;
        }
        _Var1 = Curl_uint_bset_next(&_mid->process,(uint)data,(uint *)&data);
      } while (_Var1);
    }
    uVar2 = Curl_cshutdn_add_waitfds(&_mid->cshutdn,_mid->admin,(Curl_waitfds *)local_40);
    if ((uVar2 + data._4_4_ != (int)cwfds.wfds) && (ufds != (curl_waitfd *)0x0)) {
      multi._4_4_ = CURLM_OUT_OF_MEMORY;
    }
    if (cwfds._8_8_ != 0) {
      *(uint *)cwfds._8_8_ = uVar2 + data._4_4_;
    }
    m_local._4_4_ = multi._4_4_;
  }
  else {
    m_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return m_local._4_4_;
}

Assistant:

CURLMcode curl_multi_waitfds(CURLM *m,
                             struct curl_waitfd *ufds,
                             unsigned int size,
                             unsigned int *fd_count)
{
  struct Curl_waitfds cwfds;
  CURLMcode result = CURLM_OK;
  struct Curl_multi *multi = m;
  unsigned int need = 0, mid;

  if(!ufds && (size || !fd_count))
    return CURLM_BAD_FUNCTION_ARGUMENT;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  Curl_waitfds_init(&cwfds, ufds, size);
  if(Curl_uint_bset_first(&multi->process, &mid)) {
    do {
      struct Curl_easy *data = Curl_multi_get_easy(multi, mid);
      struct easy_pollset ps;
      if(!data) {
        DEBUGASSERT(0);
        Curl_uint_bset_remove(&multi->process, mid);
        continue;
      }
      Curl_multi_getsock(data, &ps, "curl_multi_waitfds");
      need += Curl_waitfds_add_ps(&cwfds, &ps);
    }
    while(Curl_uint_bset_next(&multi->process, mid, &mid));
  }

  need += Curl_cshutdn_add_waitfds(&multi->cshutdn, multi->admin, &cwfds);

  if(need != cwfds.n && ufds) {
    result = CURLM_OUT_OF_MEMORY;
  }

  if(fd_count)
    *fd_count = need;
  return result;
}